

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Port * __thiscall
kratos::Generator::port
          (Generator *this,PortDirection direction,string *port_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,PortType type,bool is_signed)

{
  shared_ptr<kratos::Port> sVar1;
  Generator *local_48;
  undefined1 local_3c [8];
  PortDirection direction_local;
  uint32_t width_local;
  PortType type_local;
  shared_ptr<kratos::Port> p;
  bool is_signed_local;
  
  p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = is_signed
  ;
  local_48 = this;
  local_3c._0_4_ = direction;
  local_3c._4_4_ = width;
  direction_local = type;
  sVar1 = std::
          make_shared<kratos::Port,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType&,bool&>
                    ((Generator **)&width_local,(PortDirection *)&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c,
                     (uint *)port_name,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_3c + 4),
                     (PortType *)size,(bool *)&direction_local);
  (*(this->super_IRNode)._vptr_IRNode[7])
            (this,port_name,
             sVar1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi,(undefined1 *)
                   ((long)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::Port> *)&width_local);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return (Port *)_width_local;
}

Assistant:

Port &Generator::port(PortDirection direction, const std::string &port_name, uint32_t width,
                      const std::vector<uint32_t> &size, PortType type, bool is_signed) {
    auto p = std::make_shared<Port>(this, direction, port_name, width, size, type, is_signed);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}